

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.h
# Opt level: O0

void __thiscall HttpData::~HttpData(HttpData *this)

{
  int iVar1;
  int i;
  HttpData *this_local;
  
  iVar1 = close(this->fd_);
  if (iVar1 < 0) {
    printf("close faild\n");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->file_lists);
  std::weak_ptr<TimerNode>::~weak_ptr(&this->timer_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map(&this->Vedioname2Num);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->headers_);
  std::__cxx11::string::~string((string *)&this->filename_full);
  std::__cxx11::string::~string((string *)&this->para_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<void_*>_>_>_>
  ::~map(&this->mmap_local);
  std::shared_ptr<void_*>::~shared_ptr(&this->mmapRet);
  std::__cxx11::string::~string((string *)&this->application_path_prefix);
  std::__cxx11::string::~string((string *)&this->application_default_prefix);
  std::__cxx11::string::~string((string *)&this->path_);
  std::__cxx11::string::~string((string *)&this->fileName_);
  std::__cxx11::string::~string((string *)&this->outBuffer_);
  std::__cxx11::string::~string((string *)&this->inBuffer_);
  std::shared_ptr<Channel>::~shared_ptr(&this->channel_);
  std::enable_shared_from_this<HttpData>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<HttpData>);
  return;
}

Assistant:

~HttpData()
  {
    int i = close(fd_);
    if (i < 0) printf("close faild\n");
  }